

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  int iVar7;
  undefined4 uVar8;
  float fVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  byte bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  ulong uVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar60;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar70;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_16a0 [16];
  long local_1688;
  ulong local_1680;
  ulong local_1678;
  RTCFilterFunctionNArguments local_1670;
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  float local_1600;
  float fStack_15fc;
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  float fStack_15e4;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  undefined1 local_1590 [16];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  RTCHitN local_1490 [16];
  undefined1 local_1480 [16];
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined1 local_1440 [16];
  undefined1 local_1430 [16];
  uint local_1420;
  uint uStack_141c;
  uint uStack_1418;
  uint uStack_1414;
  uint uStack_1410;
  uint uStack_140c;
  uint uStack_1408;
  uint uStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  char local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220;
  size_t local_1200;
  ulong local_11f8 [569];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar33 [16];
  undefined1 auVar92 [64];
  
  puVar26 = local_11f8;
  local_1200 = root.ptr;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar93 = ZEXT3264(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar94 = ZEXT3264(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar95 = ZEXT3264(auVar35);
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar70 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar60 * 0.99999964)));
  auVar96 = ZEXT3264(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar70 * 0.99999964)));
  auVar97 = ZEXT3264(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar80 * 0.99999964)));
  auVar98 = ZEXT3264(auVar35);
  fVar60 = fVar60 * 1.0000004;
  fVar70 = fVar70 * 1.0000004;
  fVar80 = fVar80 * 1.0000004;
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1678 = uVar27 ^ 0x20;
  iVar7 = (tray->tnear).field_0.i[k];
  auVar89 = ZEXT3264(CONCAT428(iVar7,CONCAT424(iVar7,CONCAT420(iVar7,CONCAT416(iVar7,CONCAT412(iVar7
                                                  ,CONCAT48(iVar7,CONCAT44(iVar7,iVar7))))))));
  iVar7 = (tray->tfar).field_0.i[k];
  auVar90 = ZEXT3264(CONCAT428(iVar7,CONCAT424(iVar7,CONCAT420(iVar7,CONCAT416(iVar7,CONCAT412(iVar7
                                                  ,CONCAT48(iVar7,CONCAT44(iVar7,iVar7))))))));
  local_1590 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  bVar31 = true;
  fVar63 = fVar60;
  fVar64 = fVar60;
  fVar65 = fVar60;
  fVar66 = fVar60;
  fVar67 = fVar60;
  fVar68 = fVar60;
  fVar69 = fVar60;
  fVar73 = fVar70;
  fVar74 = fVar70;
  fVar75 = fVar70;
  fVar76 = fVar70;
  fVar77 = fVar70;
  fVar78 = fVar70;
  fVar79 = fVar70;
  fVar81 = fVar80;
  fVar82 = fVar80;
  fVar83 = fVar80;
  fVar84 = fVar80;
  fVar85 = fVar80;
  fVar86 = fVar80;
  fVar87 = fVar80;
  do {
    uVar28 = puVar26[-1];
    puVar26 = puVar26 + -1;
    local_1620 = auVar89._0_32_;
    local_1640 = auVar90._0_32_;
    while ((uVar28 & 8) == 0) {
      auVar35 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar28 + 0x40 + uVar27),auVar93._0_32_);
      auVar35 = vmulps_avx512vl(auVar96._0_32_,auVar35);
      auVar36 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar28 + 0x40 + uVar29),auVar94._0_32_);
      auVar36 = vmulps_avx512vl(auVar97._0_32_,auVar36);
      auVar35 = vmaxps_avx(auVar35,auVar36);
      auVar36 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar28 + 0x40 + uVar23),auVar95._0_32_);
      auVar36 = vmulps_avx512vl(auVar98._0_32_,auVar36);
      auVar36 = vmaxps_avx(auVar36,local_1620);
      auVar35 = vmaxps_avx(auVar35,auVar36);
      auVar37 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar28 + 0x40 + local_1678),auVar93._0_32_);
      auVar36._4_4_ = fVar63 * auVar37._4_4_;
      auVar36._0_4_ = fVar60 * auVar37._0_4_;
      auVar36._8_4_ = fVar64 * auVar37._8_4_;
      auVar36._12_4_ = fVar65 * auVar37._12_4_;
      auVar36._16_4_ = fVar66 * auVar37._16_4_;
      auVar36._20_4_ = fVar67 * auVar37._20_4_;
      auVar36._24_4_ = fVar68 * auVar37._24_4_;
      auVar36._28_4_ = auVar37._28_4_;
      auVar38 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar28 + 0x40 + (uVar29 ^ 0x20)),
                                auVar94._0_32_);
      auVar37._4_4_ = fVar73 * auVar38._4_4_;
      auVar37._0_4_ = fVar70 * auVar38._0_4_;
      auVar37._8_4_ = fVar74 * auVar38._8_4_;
      auVar37._12_4_ = fVar75 * auVar38._12_4_;
      auVar37._16_4_ = fVar76 * auVar38._16_4_;
      auVar37._20_4_ = fVar77 * auVar38._20_4_;
      auVar37._24_4_ = fVar78 * auVar38._24_4_;
      auVar37._28_4_ = auVar38._28_4_;
      auVar36 = vminps_avx(auVar36,auVar37);
      auVar37 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar28 + 0x40 + (uVar23 ^ 0x20)),
                                auVar95._0_32_);
      auVar38._4_4_ = fVar81 * auVar37._4_4_;
      auVar38._0_4_ = fVar80 * auVar37._0_4_;
      auVar38._8_4_ = fVar82 * auVar37._8_4_;
      auVar38._12_4_ = fVar83 * auVar37._12_4_;
      auVar38._16_4_ = fVar84 * auVar37._16_4_;
      auVar38._20_4_ = fVar85 * auVar37._20_4_;
      auVar38._24_4_ = fVar86 * auVar37._24_4_;
      auVar38._28_4_ = auVar37._28_4_;
      auVar37 = vminps_avx(auVar38,local_1640);
      auVar36 = vminps_avx(auVar36,auVar37);
      uVar24 = vcmpps_avx512vl(auVar35,auVar36,2);
      if ((char)uVar24 == '\0') goto LAB_007a3251;
      uVar20 = uVar28 & 0xfffffffffffffff0;
      lVar22 = 0;
      for (uVar28 = uVar24; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar28 = *(ulong *)(uVar20 + lVar22 * 8);
      uVar25 = (uint)uVar24 - 1 & (uint)uVar24;
      uVar24 = (ulong)uVar25;
      if (uVar25 != 0) {
        *puVar26 = uVar28;
        lVar22 = 0;
        for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
          lVar22 = lVar22 + 1;
        }
        uVar25 = uVar25 - 1 & uVar25;
        uVar24 = (ulong)uVar25;
        bVar30 = uVar25 == 0;
        while( true ) {
          puVar26 = puVar26 + 1;
          uVar28 = *(ulong *)(uVar20 + lVar22 * 8);
          if (bVar30) break;
          *puVar26 = uVar28;
          lVar22 = 0;
          for (uVar28 = uVar24; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
            lVar22 = lVar22 + 1;
          }
          uVar24 = uVar24 - 1 & uVar24;
          bVar30 = uVar24 == 0;
        }
      }
    }
    uVar24 = (ulong)((uint)uVar28 & 0xf);
    if (uVar24 != 8) {
      uVar28 = uVar28 & 0xfffffffffffffff0;
      local_1688 = 0;
      local_1600 = fVar80;
      fStack_15fc = fVar81;
      fStack_15f8 = fVar82;
      fStack_15f4 = fVar83;
      fStack_15f0 = fVar84;
      fStack_15ec = fVar85;
      fStack_15e8 = fVar86;
      fStack_15e4 = fVar87;
      local_15e0 = fVar70;
      fStack_15dc = fVar73;
      fStack_15d8 = fVar74;
      fStack_15d4 = fVar75;
      fStack_15d0 = fVar76;
      fStack_15cc = fVar77;
      fStack_15c8 = fVar78;
      fStack_15c4 = fVar79;
      local_15c0 = fVar60;
      fStack_15bc = fVar63;
      fStack_15b8 = fVar64;
      fStack_15b4 = fVar65;
      fStack_15b0 = fVar66;
      fStack_15ac = fVar67;
      fStack_15a8 = fVar68;
      fStack_15a4 = fVar69;
      do {
        lVar21 = local_1688 * 0xe0;
        lVar22 = uVar28 + 0xd0 + lVar21;
        local_1400 = *(undefined8 *)(lVar22 + 0x10);
        uStack_13f8 = *(undefined8 *)(lVar22 + 0x18);
        lVar22 = uVar28 + 0xc0 + lVar21;
        local_13e0 = *(undefined8 *)(lVar22 + 0x10);
        uStack_13d8 = *(undefined8 *)(lVar22 + 0x18);
        uStack_13d0 = local_13e0;
        uStack_13c8 = uStack_13d8;
        uStack_13f0 = local_1400;
        uStack_13e8 = uStack_13f8;
        auVar35._16_16_ = *(undefined1 (*) [16])(uVar28 + 0x60 + lVar21);
        auVar35._0_16_ = *(undefined1 (*) [16])(uVar28 + lVar21);
        auVar39._16_16_ = *(undefined1 (*) [16])(uVar28 + 0x70 + lVar21);
        auVar39._0_16_ = *(undefined1 (*) [16])(uVar28 + 0x10 + lVar21);
        auVar40._16_16_ = *(undefined1 (*) [16])(uVar28 + 0x80 + lVar21);
        auVar40._0_16_ = *(undefined1 (*) [16])(uVar28 + 0x20 + lVar21);
        auVar34 = *(undefined1 (*) [16])(uVar28 + 0x30 + lVar21);
        auVar45._16_16_ = auVar34;
        auVar45._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar28 + 0x40 + lVar21);
        auVar46._16_16_ = auVar34;
        auVar46._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar28 + 0x50 + lVar21);
        auVar47._16_16_ = auVar34;
        auVar47._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar28 + 0x90 + lVar21);
        auVar48._16_16_ = auVar34;
        auVar48._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar28 + 0xa0 + lVar21);
        auVar49._16_16_ = auVar34;
        auVar49._0_16_ = auVar34;
        auVar34 = *(undefined1 (*) [16])(uVar28 + 0xb0 + lVar21);
        auVar50._16_16_ = auVar34;
        auVar50._0_16_ = auVar34;
        uVar8 = *(undefined4 *)(ray + k * 4);
        auVar51._4_4_ = uVar8;
        auVar51._0_4_ = uVar8;
        auVar51._8_4_ = uVar8;
        auVar51._12_4_ = uVar8;
        auVar51._16_4_ = uVar8;
        auVar51._20_4_ = uVar8;
        auVar51._24_4_ = uVar8;
        auVar51._28_4_ = uVar8;
        auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar61._4_4_ = uVar8;
        auVar61._0_4_ = uVar8;
        auVar61._8_4_ = uVar8;
        auVar61._12_4_ = uVar8;
        auVar61._16_4_ = uVar8;
        auVar61._20_4_ = uVar8;
        auVar61._24_4_ = uVar8;
        auVar61._28_4_ = uVar8;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar71._4_4_ = uVar8;
        auVar71._0_4_ = uVar8;
        auVar71._8_4_ = uVar8;
        auVar71._12_4_ = uVar8;
        auVar71._16_4_ = uVar8;
        auVar71._20_4_ = uVar8;
        auVar71._24_4_ = uVar8;
        auVar71._28_4_ = uVar8;
        fVar9 = *(float *)(ray + k * 4 + 0x60);
        auVar88._4_4_ = fVar9;
        auVar88._0_4_ = fVar9;
        auVar88._8_4_ = fVar9;
        auVar88._12_4_ = fVar9;
        auVar88._16_4_ = fVar9;
        auVar88._20_4_ = fVar9;
        auVar88._24_4_ = fVar9;
        auVar88._28_4_ = fVar9;
        auVar35 = vsubps_avx(auVar35,auVar51);
        auVar39 = vsubps_avx512vl(auVar39,auVar37);
        auVar40 = vsubps_avx512vl(auVar40,auVar38);
        auVar41 = vsubps_avx512vl(auVar45,auVar51);
        auVar42 = vsubps_avx512vl(auVar46,auVar37);
        auVar43 = vsubps_avx512vl(auVar47,auVar38);
        auVar36 = vsubps_avx(auVar48,auVar51);
        auVar44 = vsubps_avx512vl(auVar49,auVar37);
        auVar45 = vsubps_avx512vl(auVar50,auVar38);
        auVar37 = vsubps_avx(auVar36,auVar35);
        auVar46 = vsubps_avx512vl(auVar44,auVar39);
        auVar38 = vsubps_avx(auVar45,auVar40);
        auVar47 = vsubps_avx512vl(auVar35,auVar41);
        auVar48 = vsubps_avx512vl(auVar39,auVar42);
        auVar49 = vsubps_avx512vl(auVar40,auVar43);
        auVar50 = vsubps_avx512vl(auVar41,auVar36);
        auVar51 = vsubps_avx512vl(auVar42,auVar44);
        auVar52 = vsubps_avx512vl(auVar43,auVar45);
        auVar57._0_4_ = auVar36._0_4_ + auVar35._0_4_;
        auVar57._4_4_ = auVar36._4_4_ + auVar35._4_4_;
        auVar57._8_4_ = auVar36._8_4_ + auVar35._8_4_;
        auVar57._12_4_ = auVar36._12_4_ + auVar35._12_4_;
        auVar57._16_4_ = auVar36._16_4_ + auVar35._16_4_;
        auVar57._20_4_ = auVar36._20_4_ + auVar35._20_4_;
        auVar57._24_4_ = auVar36._24_4_ + auVar35._24_4_;
        auVar57._28_4_ = auVar36._28_4_ + auVar35._28_4_;
        auVar53 = vaddps_avx512vl(auVar44,auVar39);
        auVar54 = vaddps_avx512vl(auVar45,auVar40);
        auVar55 = vmulps_avx512vl(auVar53,auVar38);
        auVar55 = vfmsub231ps_avx512vl(auVar55,auVar46,auVar54);
        auVar54 = vmulps_avx512vl(auVar54,auVar37);
        auVar56 = vfmsub231ps_avx512vl(auVar54,auVar38,auVar57);
        auVar54._4_4_ = auVar46._4_4_ * auVar57._4_4_;
        auVar54._0_4_ = auVar46._0_4_ * auVar57._0_4_;
        auVar54._8_4_ = auVar46._8_4_ * auVar57._8_4_;
        auVar54._12_4_ = auVar46._12_4_ * auVar57._12_4_;
        auVar54._16_4_ = auVar46._16_4_ * auVar57._16_4_;
        auVar54._20_4_ = auVar46._20_4_ * auVar57._20_4_;
        auVar54._24_4_ = auVar46._24_4_ * auVar57._24_4_;
        auVar54._28_4_ = auVar57._28_4_;
        auVar34 = vfmsub231ps_fma(auVar54,auVar37,auVar53);
        auVar58._0_4_ = fVar9 * auVar34._0_4_;
        auVar58._4_4_ = fVar9 * auVar34._4_4_;
        auVar58._8_4_ = fVar9 * auVar34._8_4_;
        auVar58._12_4_ = fVar9 * auVar34._12_4_;
        auVar58._16_4_ = fVar9 * 0.0;
        auVar58._20_4_ = fVar9 * 0.0;
        auVar58._24_4_ = fVar9 * 0.0;
        auVar58._28_4_ = 0;
        auVar54 = vfmadd231ps_avx512vl(auVar58,auVar71,auVar56);
        local_13c0 = vfmadd231ps_avx512vl(auVar54,auVar61,auVar55);
        auVar54 = vaddps_avx512vl(auVar35,auVar41);
        auVar53 = vaddps_avx512vl(auVar39,auVar42);
        auVar55 = vaddps_avx512vl(auVar40,auVar43);
        auVar56 = vmulps_avx512vl(auVar53,auVar49);
        auVar56 = vfmsub231ps_avx512vl(auVar56,auVar48,auVar55);
        auVar55 = vmulps_avx512vl(auVar55,auVar47);
        auVar55 = vfmsub231ps_avx512vl(auVar55,auVar49,auVar54);
        auVar54 = vmulps_avx512vl(auVar54,auVar48);
        auVar54 = vfmsub231ps_avx512vl(auVar54,auVar47,auVar53);
        auVar53._4_4_ = fVar9 * auVar54._4_4_;
        auVar53._0_4_ = fVar9 * auVar54._0_4_;
        auVar53._8_4_ = fVar9 * auVar54._8_4_;
        auVar53._12_4_ = fVar9 * auVar54._12_4_;
        auVar53._16_4_ = fVar9 * auVar54._16_4_;
        auVar53._20_4_ = fVar9 * auVar54._20_4_;
        auVar53._24_4_ = fVar9 * auVar54._24_4_;
        auVar53._28_4_ = auVar54._28_4_;
        auVar54 = vfmadd231ps_avx512vl(auVar53,auVar71,auVar55);
        local_13a0 = vfmadd231ps_avx512vl(auVar54,auVar61,auVar56);
        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar36 = vaddps_avx512vl(auVar41,auVar36);
        auVar41 = vaddps_avx512vl(auVar42,auVar44);
        auVar42 = vaddps_avx512vl(auVar43,auVar45);
        auVar53 = vmulps_avx512vl(auVar41,auVar52);
        auVar53 = vfmsub231ps_avx512vl(auVar53,auVar51,auVar42);
        auVar43._4_4_ = auVar42._4_4_ * auVar50._4_4_;
        auVar43._0_4_ = auVar42._0_4_ * auVar50._0_4_;
        auVar43._8_4_ = auVar42._8_4_ * auVar50._8_4_;
        auVar43._12_4_ = auVar42._12_4_ * auVar50._12_4_;
        auVar43._16_4_ = auVar42._16_4_ * auVar50._16_4_;
        auVar43._20_4_ = auVar42._20_4_ * auVar50._20_4_;
        auVar43._24_4_ = auVar42._24_4_ * auVar50._24_4_;
        auVar43._28_4_ = auVar42._28_4_;
        auVar34 = vfmsub231ps_fma(auVar43,auVar52,auVar36);
        auVar44._4_4_ = auVar36._4_4_ * auVar51._4_4_;
        auVar44._0_4_ = auVar36._0_4_ * auVar51._0_4_;
        auVar44._8_4_ = auVar36._8_4_ * auVar51._8_4_;
        auVar44._12_4_ = auVar36._12_4_ * auVar51._12_4_;
        auVar44._16_4_ = auVar36._16_4_ * auVar51._16_4_;
        auVar44._20_4_ = auVar36._20_4_ * auVar51._20_4_;
        auVar44._24_4_ = auVar36._24_4_ * auVar51._24_4_;
        auVar44._28_4_ = auVar36._28_4_;
        auVar36 = vfmsub231ps_avx512vl(auVar44,auVar50,auVar41);
        auVar36 = vmulps_avx512vl(auVar36,auVar88);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar71,ZEXT1632(auVar34));
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar61,auVar53);
        auVar55._0_4_ = local_13c0._0_4_ + local_13a0._0_4_;
        auVar55._4_4_ = local_13c0._4_4_ + local_13a0._4_4_;
        auVar55._8_4_ = local_13c0._8_4_ + local_13a0._8_4_;
        auVar55._12_4_ = local_13c0._12_4_ + local_13a0._12_4_;
        auVar55._16_4_ = local_13c0._16_4_ + local_13a0._16_4_;
        auVar55._20_4_ = local_13c0._20_4_ + local_13a0._20_4_;
        auVar55._24_4_ = local_13c0._24_4_ + local_13a0._24_4_;
        auVar55._28_4_ = local_13c0._28_4_ + local_13a0._28_4_;
        local_1380 = vaddps_avx512vl(auVar36,auVar55);
        vandps_avx512vl(local_1380,auVar54);
        auVar41._8_4_ = 0x34000000;
        auVar41._0_8_ = 0x3400000034000000;
        auVar41._12_4_ = 0x34000000;
        auVar41._16_4_ = 0x34000000;
        auVar41._20_4_ = 0x34000000;
        auVar41._24_4_ = 0x34000000;
        auVar41._28_4_ = 0x34000000;
        auVar41 = vmulps_avx512vl(local_1380,auVar41);
        auVar42 = vminps_avx512vl(local_13c0,local_13a0);
        auVar53 = vminps_avx512vl(auVar42,auVar36);
        auVar42._8_4_ = 0x80000000;
        auVar42._0_8_ = 0x8000000080000000;
        auVar42._12_4_ = 0x80000000;
        auVar42._16_4_ = 0x80000000;
        auVar42._20_4_ = 0x80000000;
        auVar42._24_4_ = 0x80000000;
        auVar42._28_4_ = 0x80000000;
        auVar42 = vxorps_avx512vl(auVar41,auVar42);
        uVar13 = vcmpps_avx512vl(auVar53,auVar42,5);
        auVar42 = vmaxps_avx512vl(local_13c0,local_13a0);
        auVar36 = vmaxps_avx512vl(auVar42,auVar36);
        uVar14 = vcmpps_avx512vl(auVar36,auVar41,2);
        bVar16 = (byte)uVar13 | (byte)uVar14;
        fVar63 = fStack_15bc;
        fVar64 = fStack_15b8;
        fVar65 = fStack_15b4;
        fVar66 = fStack_15b0;
        fVar67 = fStack_15ac;
        fVar68 = fStack_15a8;
        fVar69 = fStack_15a4;
        fVar60 = local_15c0;
        fVar73 = fStack_15dc;
        fVar74 = fStack_15d8;
        fVar75 = fStack_15d4;
        fVar76 = fStack_15d0;
        fVar77 = fStack_15cc;
        fVar78 = fStack_15c8;
        fVar79 = fStack_15c4;
        fVar70 = local_15e0;
        fVar81 = fStack_15fc;
        fVar82 = fStack_15f8;
        fVar83 = fStack_15f4;
        fVar84 = fStack_15f0;
        fVar85 = fStack_15ec;
        fVar86 = fStack_15e8;
        fVar87 = fStack_15e4;
        fVar80 = local_1600;
        if (bVar16 == 0) {
LAB_007a3218:
          auVar89 = ZEXT3264(local_1620);
          auVar90 = ZEXT3264(local_1640);
        }
        else {
          auVar36 = vmulps_avx512vl(auVar48,auVar38);
          auVar41 = vmulps_avx512vl(auVar37,auVar49);
          auVar42 = vmulps_avx512vl(auVar47,auVar46);
          auVar53 = vmulps_avx512vl(auVar51,auVar49);
          auVar43 = vmulps_avx512vl(auVar47,auVar52);
          auVar44 = vmulps_avx512vl(auVar50,auVar48);
          auVar45 = vfmsub213ps_avx512vl(auVar46,auVar49,auVar36);
          auVar38 = vfmsub213ps_avx512vl(auVar38,auVar47,auVar41);
          auVar37 = vfmsub213ps_avx512vl(auVar37,auVar48,auVar42);
          auVar46 = vfmsub213ps_avx512vl(auVar52,auVar48,auVar53);
          auVar48 = vfmsub213ps_avx512vl(auVar50,auVar49,auVar43);
          auVar47 = vfmsub213ps_avx512vl(auVar51,auVar47,auVar44);
          vandps_avx512vl(auVar36,auVar54);
          vandps_avx512vl(auVar53,auVar54);
          uVar20 = vcmpps_avx512vl(auVar47,auVar47,1);
          vandps_avx512vl(auVar41,auVar54);
          vandps_avx512vl(auVar43,auVar54);
          uVar32 = vcmpps_avx512vl(auVar47,auVar47,1);
          vandps_avx512vl(auVar42,auVar54);
          vandps_avx512vl(auVar44,auVar54);
          uVar15 = vcmpps_avx512vl(auVar47,auVar47,1);
          bVar30 = (bool)((byte)uVar20 & 1);
          local_1360._0_4_ = (float)((uint)bVar30 * auVar45._0_4_ | (uint)!bVar30 * auVar46._0_4_);
          bVar30 = (bool)((byte)(uVar20 >> 1) & 1);
          local_1360._4_4_ = (float)((uint)bVar30 * auVar45._4_4_ | (uint)!bVar30 * auVar46._4_4_);
          bVar30 = (bool)((byte)(uVar20 >> 2) & 1);
          local_1360._8_4_ = (float)((uint)bVar30 * auVar45._8_4_ | (uint)!bVar30 * auVar46._8_4_);
          bVar30 = (bool)((byte)(uVar20 >> 3) & 1);
          local_1360._12_4_ =
               (float)((uint)bVar30 * auVar45._12_4_ | (uint)!bVar30 * auVar46._12_4_);
          bVar30 = (bool)((byte)(uVar20 >> 4) & 1);
          local_1360._16_4_ =
               (float)((uint)bVar30 * auVar45._16_4_ | (uint)!bVar30 * auVar46._16_4_);
          bVar30 = (bool)((byte)(uVar20 >> 5) & 1);
          local_1360._20_4_ =
               (float)((uint)bVar30 * auVar45._20_4_ | (uint)!bVar30 * auVar46._20_4_);
          bVar30 = (bool)((byte)(uVar20 >> 6) & 1);
          local_1360._24_4_ =
               (float)((uint)bVar30 * auVar45._24_4_ | (uint)!bVar30 * auVar46._24_4_);
          bVar30 = SUB81(uVar20 >> 7,0);
          local_1360._28_4_ = (uint)bVar30 * auVar45._28_4_ | (uint)!bVar30 * auVar46._28_4_;
          bVar30 = (bool)((byte)uVar32 & 1);
          local_1340._0_4_ = (float)((uint)bVar30 * auVar38._0_4_ | (uint)!bVar30 * auVar48._0_4_);
          bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
          local_1340._4_4_ = (float)((uint)bVar30 * auVar38._4_4_ | (uint)!bVar30 * auVar48._4_4_);
          bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
          local_1340._8_4_ = (float)((uint)bVar30 * auVar38._8_4_ | (uint)!bVar30 * auVar48._8_4_);
          bVar30 = (bool)((byte)(uVar32 >> 3) & 1);
          local_1340._12_4_ =
               (float)((uint)bVar30 * auVar38._12_4_ | (uint)!bVar30 * auVar48._12_4_);
          bVar30 = (bool)((byte)(uVar32 >> 4) & 1);
          local_1340._16_4_ =
               (float)((uint)bVar30 * auVar38._16_4_ | (uint)!bVar30 * auVar48._16_4_);
          bVar30 = (bool)((byte)(uVar32 >> 5) & 1);
          local_1340._20_4_ =
               (float)((uint)bVar30 * auVar38._20_4_ | (uint)!bVar30 * auVar48._20_4_);
          bVar30 = (bool)((byte)(uVar32 >> 6) & 1);
          local_1340._24_4_ =
               (float)((uint)bVar30 * auVar38._24_4_ | (uint)!bVar30 * auVar48._24_4_);
          bVar30 = SUB81(uVar32 >> 7,0);
          local_1340._28_4_ = (uint)bVar30 * auVar38._28_4_ | (uint)!bVar30 * auVar48._28_4_;
          bVar30 = (bool)((byte)uVar15 & 1);
          local_1320._0_4_ = (float)((uint)bVar30 * auVar37._0_4_ | (uint)!bVar30 * auVar47._0_4_);
          bVar30 = (bool)((byte)(uVar15 >> 1) & 1);
          local_1320._4_4_ = (float)((uint)bVar30 * auVar37._4_4_ | (uint)!bVar30 * auVar47._4_4_);
          bVar30 = (bool)((byte)(uVar15 >> 2) & 1);
          local_1320._8_4_ = (float)((uint)bVar30 * auVar37._8_4_ | (uint)!bVar30 * auVar47._8_4_);
          bVar30 = (bool)((byte)(uVar15 >> 3) & 1);
          local_1320._12_4_ =
               (float)((uint)bVar30 * auVar37._12_4_ | (uint)!bVar30 * auVar47._12_4_);
          bVar30 = (bool)((byte)(uVar15 >> 4) & 1);
          local_1320._16_4_ =
               (float)((uint)bVar30 * auVar37._16_4_ | (uint)!bVar30 * auVar47._16_4_);
          bVar30 = (bool)((byte)(uVar15 >> 5) & 1);
          local_1320._20_4_ =
               (float)((uint)bVar30 * auVar37._20_4_ | (uint)!bVar30 * auVar47._20_4_);
          bVar30 = (bool)((byte)(uVar15 >> 6) & 1);
          local_1320._24_4_ =
               (float)((uint)bVar30 * auVar37._24_4_ | (uint)!bVar30 * auVar47._24_4_);
          bVar30 = SUB81(uVar15 >> 7,0);
          local_1320._28_4_ = (uint)bVar30 * auVar37._28_4_ | (uint)!bVar30 * auVar47._28_4_;
          auVar17._4_4_ = fVar9 * local_1320._4_4_;
          auVar17._0_4_ = fVar9 * local_1320._0_4_;
          auVar17._8_4_ = fVar9 * local_1320._8_4_;
          auVar17._12_4_ = fVar9 * local_1320._12_4_;
          auVar17._16_4_ = fVar9 * local_1320._16_4_;
          auVar17._20_4_ = fVar9 * local_1320._20_4_;
          auVar17._24_4_ = fVar9 * local_1320._24_4_;
          auVar17._28_4_ = fVar9;
          auVar34 = vfmadd213ps_fma(auVar71,local_1340,auVar17);
          auVar34 = vfmadd213ps_fma(auVar61,local_1360,ZEXT1632(auVar34));
          auVar37 = ZEXT1632(CONCAT412(auVar34._12_4_ + auVar34._12_4_,
                                       CONCAT48(auVar34._8_4_ + auVar34._8_4_,
                                                CONCAT44(auVar34._4_4_ + auVar34._4_4_,
                                                         auVar34._0_4_ + auVar34._0_4_))));
          auVar72._0_4_ = auVar40._0_4_ * local_1320._0_4_;
          auVar72._4_4_ = auVar40._4_4_ * local_1320._4_4_;
          auVar72._8_4_ = auVar40._8_4_ * local_1320._8_4_;
          auVar72._12_4_ = auVar40._12_4_ * local_1320._12_4_;
          auVar72._16_4_ = auVar40._16_4_ * local_1320._16_4_;
          auVar72._20_4_ = auVar40._20_4_ * local_1320._20_4_;
          auVar72._24_4_ = auVar40._24_4_ * local_1320._24_4_;
          auVar72._28_4_ = 0;
          auVar34 = vfmadd213ps_fma(auVar39,local_1340,auVar72);
          auVar33 = vfmadd213ps_fma(auVar35,local_1360,ZEXT1632(auVar34));
          auVar35 = vrcp14ps_avx512vl(auVar37);
          auVar52._8_4_ = 0x3f800000;
          auVar52._0_8_ = 0x3f8000003f800000;
          auVar52._12_4_ = 0x3f800000;
          auVar52._16_4_ = 0x3f800000;
          auVar52._20_4_ = 0x3f800000;
          auVar52._24_4_ = 0x3f800000;
          auVar52._28_4_ = 0x3f800000;
          auVar36 = vfnmadd213ps_avx512vl(auVar35,auVar37,auVar52);
          auVar34 = vfmadd132ps_fma(auVar36,auVar35,auVar35);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar91._4_4_ = uVar8;
          auVar91._0_4_ = uVar8;
          auVar91._8_4_ = uVar8;
          auVar91._12_4_ = uVar8;
          auVar91._16_4_ = uVar8;
          auVar91._20_4_ = uVar8;
          auVar91._24_4_ = uVar8;
          auVar91._28_4_ = uVar8;
          auVar92 = ZEXT3264(auVar91);
          local_12a0 = ZEXT1632(CONCAT412(auVar34._12_4_ * (auVar33._12_4_ + auVar33._12_4_),
                                          CONCAT48(auVar34._8_4_ * (auVar33._8_4_ + auVar33._8_4_),
                                                   CONCAT44(auVar34._4_4_ *
                                                            (auVar33._4_4_ + auVar33._4_4_),
                                                            auVar34._0_4_ *
                                                            (auVar33._0_4_ + auVar33._0_4_)))));
          uVar13 = vcmpps_avx512vl(local_12a0,auVar91,2);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar56._4_4_ = uVar8;
          auVar56._0_4_ = uVar8;
          auVar56._8_4_ = uVar8;
          auVar56._12_4_ = uVar8;
          auVar56._16_4_ = uVar8;
          auVar56._20_4_ = uVar8;
          auVar56._24_4_ = uVar8;
          auVar56._28_4_ = uVar8;
          uVar14 = vcmpps_avx512vl(local_12a0,auVar56,0xd);
          bVar16 = (byte)uVar13 & (byte)uVar14 & bVar16;
          if (bVar16 == 0) goto LAB_007a3218;
          local_1680 = vcmpps_avx512vl(auVar37,_DAT_01faff00,4);
          local_1680 = bVar16 & local_1680;
          if ((char)local_1680 == '\0') goto LAB_007a3218;
          local_1300 = (char)local_1680;
          local_1220 = 0xf0;
          pSVar10 = context->scene;
          auVar59._8_4_ = 0x219392ef;
          auVar59._0_8_ = 0x219392ef219392ef;
          auVar59._12_4_ = 0x219392ef;
          auVar59._16_4_ = 0x219392ef;
          auVar59._20_4_ = 0x219392ef;
          auVar59._24_4_ = 0x219392ef;
          auVar59._28_4_ = 0x219392ef;
          uVar20 = vcmpps_avx512vl(local_1380,auVar59,5);
          auVar36 = vrcp14ps_avx512vl(local_1380);
          auVar62._8_4_ = 0x3f800000;
          auVar62._0_8_ = 0x3f8000003f800000;
          auVar62._12_4_ = 0x3f800000;
          auVar62._16_4_ = 0x3f800000;
          auVar62._20_4_ = 0x3f800000;
          auVar62._24_4_ = 0x3f800000;
          auVar62._28_4_ = 0x3f800000;
          auVar34 = vfnmadd213ps_fma(local_1380,auVar36,auVar62);
          auVar35 = vfmadd132ps_avx512vl(ZEXT1632(auVar34),auVar36,auVar36);
          fVar1 = (float)((uint)((byte)uVar20 & 1) * auVar35._0_4_);
          fVar2 = (float)((uint)((byte)(uVar20 >> 1) & 1) * auVar35._4_4_);
          fVar3 = (float)((uint)((byte)(uVar20 >> 2) & 1) * auVar35._8_4_);
          fVar4 = (float)((uint)((byte)(uVar20 >> 3) & 1) * auVar35._12_4_);
          fVar5 = (float)((uint)((byte)(uVar20 >> 4) & 1) * auVar35._16_4_);
          fVar6 = (float)((uint)((byte)(uVar20 >> 5) & 1) * auVar35._20_4_);
          fVar9 = (float)((uint)((byte)(uVar20 >> 6) & 1) * auVar35._24_4_);
          auVar18._4_4_ = fVar2 * local_13c0._4_4_;
          auVar18._0_4_ = fVar1 * local_13c0._0_4_;
          auVar18._8_4_ = fVar3 * local_13c0._8_4_;
          auVar18._12_4_ = fVar4 * local_13c0._12_4_;
          auVar18._16_4_ = fVar5 * local_13c0._16_4_;
          auVar18._20_4_ = fVar6 * local_13c0._20_4_;
          auVar18._24_4_ = fVar9 * local_13c0._24_4_;
          auVar18._28_4_ = local_13c0._28_4_;
          auVar35 = vminps_avx(auVar18,auVar62);
          auVar19._4_4_ = fVar2 * local_13a0._4_4_;
          auVar19._0_4_ = fVar1 * local_13a0._0_4_;
          auVar19._8_4_ = fVar3 * local_13a0._8_4_;
          auVar19._12_4_ = fVar4 * local_13a0._12_4_;
          auVar19._16_4_ = fVar5 * local_13a0._16_4_;
          auVar19._20_4_ = fVar6 * local_13a0._20_4_;
          auVar19._24_4_ = fVar9 * local_13a0._24_4_;
          auVar19._28_4_ = auVar36._28_4_;
          auVar36 = vminps_avx(auVar19,auVar62);
          auVar37 = vsubps_avx(auVar62,auVar35);
          auVar38 = vsubps_avx(auVar62,auVar36);
          local_12c0 = vblendps_avx(auVar36,auVar37,0xf0);
          local_12e0 = vblendps_avx(auVar35,auVar38,0xf0);
          fVar9 = (float)DAT_01fef940;
          fVar6 = DAT_01fef940._4_4_;
          local_1280._4_4_ = local_1360._4_4_ * fVar6;
          local_1280._0_4_ = local_1360._0_4_ * fVar9;
          fVar5 = DAT_01fef940._8_4_;
          local_1280._8_4_ = local_1360._8_4_ * fVar5;
          fVar4 = DAT_01fef940._12_4_;
          local_1280._12_4_ = local_1360._12_4_ * fVar4;
          fVar3 = DAT_01fef940._16_4_;
          local_1280._16_4_ = local_1360._16_4_ * fVar3;
          fVar2 = DAT_01fef940._20_4_;
          local_1280._20_4_ = local_1360._20_4_ * fVar2;
          fVar1 = DAT_01fef940._24_4_;
          local_1280._24_4_ = local_1360._24_4_ * fVar1;
          local_1280._28_4_ = local_1360._28_4_;
          local_1260._4_4_ = local_1340._4_4_ * fVar6;
          local_1260._0_4_ = local_1340._0_4_ * fVar9;
          local_1260._8_4_ = local_1340._8_4_ * fVar5;
          local_1260._12_4_ = local_1340._12_4_ * fVar4;
          local_1260._16_4_ = local_1340._16_4_ * fVar3;
          local_1260._20_4_ = local_1340._20_4_ * fVar2;
          local_1260._24_4_ = local_1340._24_4_ * fVar1;
          local_1260._28_4_ = local_1340._28_4_;
          local_1240._4_4_ = local_1320._4_4_ * fVar6;
          local_1240._0_4_ = local_1320._0_4_ * fVar9;
          local_1240._8_4_ = local_1320._8_4_ * fVar5;
          local_1240._12_4_ = local_1320._12_4_ * fVar4;
          local_1240._16_4_ = local_1320._16_4_ * fVar3;
          local_1240._20_4_ = local_1320._20_4_ * fVar2;
          local_1240._24_4_ = local_1320._24_4_ * fVar1;
          local_1240._28_4_ = local_1320._28_4_;
          auVar89 = ZEXT3264(local_1620);
          auVar90 = ZEXT3264(local_1640);
          do {
            local_14c0 = auVar93._0_32_;
            uVar20 = 0;
            for (uVar32 = local_1680; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000)
            {
              uVar20 = uVar20 + 1;
            }
            pGVar11 = (pSVar10->geometries).items[*(uint *)((long)&local_13e0 + uVar20 * 4)].ptr;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              local_1680 = local_1680 ^ 1L << (uVar20 & 0x3f);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_007a3267:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar31;
              }
              uVar32 = (ulong)(uint)((int)uVar20 * 4);
              uVar8 = *(undefined4 *)(local_12e0 + uVar32);
              local_1460._4_4_ = uVar8;
              local_1460._0_4_ = uVar8;
              local_1460._8_4_ = uVar8;
              local_1460._12_4_ = uVar8;
              uVar8 = *(undefined4 *)(local_12c0 + uVar32);
              local_1450._4_4_ = uVar8;
              local_1450._0_4_ = uVar8;
              local_1450._8_4_ = uVar8;
              local_1450._12_4_ = uVar8;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar32);
              local_1670.context = context->user;
              local_1430 = vpbroadcastd_avx512vl();
              uVar8 = *(undefined4 *)((long)&local_1400 + uVar32);
              local_1440._4_4_ = uVar8;
              local_1440._0_4_ = uVar8;
              local_1440._8_4_ = uVar8;
              local_1440._12_4_ = uVar8;
              uVar8 = *(undefined4 *)(local_1280 + uVar32);
              local_1490._4_4_ = uVar8;
              local_1490._0_4_ = uVar8;
              local_1490._8_4_ = uVar8;
              local_1490._12_4_ = uVar8;
              uVar8 = *(undefined4 *)(local_1260 + uVar32);
              local_1480._4_4_ = uVar8;
              local_1480._0_4_ = uVar8;
              local_1480._8_4_ = uVar8;
              local_1480._12_4_ = uVar8;
              uVar8 = *(undefined4 *)(local_1240 + uVar32);
              local_1470._4_4_ = uVar8;
              local_1470._0_4_ = uVar8;
              local_1470._8_4_ = uVar8;
              local_1470._12_4_ = uVar8;
              vpcmpeqd_avx2(ZEXT1632(local_1430),ZEXT1632(local_1430));
              uStack_141c = (local_1670.context)->instID[0];
              local_1420 = uStack_141c;
              uStack_1418 = uStack_141c;
              uStack_1414 = uStack_141c;
              uStack_1410 = (local_1670.context)->instPrimID[0];
              uStack_140c = uStack_1410;
              uStack_1408 = uStack_1410;
              uStack_1404 = uStack_1410;
              local_16a0 = local_1590;
              local_1670.valid = (int *)local_16a0;
              local_1670.geometryUserPtr = pGVar11->userPtr;
              local_1670.hit = local_1490;
              local_1670.N = 4;
              local_14e0 = auVar94._0_32_;
              local_1500 = auVar95._0_32_;
              local_1520 = auVar96._0_32_;
              local_1540 = auVar97._0_32_;
              local_1560 = auVar98._0_32_;
              local_1580 = auVar92._0_32_;
              local_1670.ray = (RTCRayN *)ray;
              if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar11->occlusionFilterN)(&local_1670);
                auVar92 = ZEXT3264(local_1580);
                auVar90 = ZEXT3264(local_1640);
                auVar89 = ZEXT3264(local_1620);
                auVar98 = ZEXT3264(local_1560);
                auVar97 = ZEXT3264(local_1540);
                auVar96 = ZEXT3264(local_1520);
                auVar95 = ZEXT3264(local_1500);
                auVar94 = ZEXT3264(local_14e0);
                auVar93 = ZEXT3264(local_14c0);
                fVar60 = local_15c0;
                fVar63 = fStack_15bc;
                fVar64 = fStack_15b8;
                fVar65 = fStack_15b4;
                fVar66 = fStack_15b0;
                fVar67 = fStack_15ac;
                fVar68 = fStack_15a8;
                fVar69 = fStack_15a4;
                fVar70 = local_15e0;
                fVar73 = fStack_15dc;
                fVar74 = fStack_15d8;
                fVar75 = fStack_15d4;
                fVar76 = fStack_15d0;
                fVar77 = fStack_15cc;
                fVar78 = fStack_15c8;
                fVar79 = fStack_15c4;
                fVar80 = local_1600;
                fVar81 = fStack_15fc;
                fVar82 = fStack_15f8;
                fVar83 = fStack_15f4;
                fVar84 = fStack_15f0;
                fVar85 = fStack_15ec;
                fVar86 = fStack_15e8;
                fVar87 = fStack_15e4;
              }
              uVar32 = vptestmd_avx512vl(local_16a0,local_16a0);
              if ((uVar32 & 0xf) != 0) {
                p_Var12 = context->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var12)(&local_1670);
                  auVar92 = ZEXT3264(local_1580);
                  auVar90 = ZEXT3264(local_1640);
                  auVar89 = ZEXT3264(local_1620);
                  auVar98 = ZEXT3264(local_1560);
                  auVar97 = ZEXT3264(local_1540);
                  auVar96 = ZEXT3264(local_1520);
                  auVar95 = ZEXT3264(local_1500);
                  auVar94 = ZEXT3264(local_14e0);
                  auVar93 = ZEXT3264(local_14c0);
                  fVar60 = local_15c0;
                  fVar63 = fStack_15bc;
                  fVar64 = fStack_15b8;
                  fVar65 = fStack_15b4;
                  fVar66 = fStack_15b0;
                  fVar67 = fStack_15ac;
                  fVar68 = fStack_15a8;
                  fVar69 = fStack_15a4;
                  fVar70 = local_15e0;
                  fVar73 = fStack_15dc;
                  fVar74 = fStack_15d8;
                  fVar75 = fStack_15d4;
                  fVar76 = fStack_15d0;
                  fVar77 = fStack_15cc;
                  fVar78 = fStack_15c8;
                  fVar79 = fStack_15c4;
                  fVar80 = local_1600;
                  fVar81 = fStack_15fc;
                  fVar82 = fStack_15f8;
                  fVar83 = fStack_15f4;
                  fVar84 = fStack_15f0;
                  fVar85 = fStack_15ec;
                  fVar86 = fStack_15e8;
                  fVar87 = fStack_15e4;
                }
                uVar32 = vptestmd_avx512vl(local_16a0,local_16a0);
                uVar32 = uVar32 & 0xf;
                auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar30 = (bool)((byte)uVar32 & 1);
                auVar34._0_4_ =
                     (uint)bVar30 * auVar33._0_4_ | (uint)!bVar30 * *(int *)(local_1670.ray + 0x80);
                bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
                auVar34._4_4_ =
                     (uint)bVar30 * auVar33._4_4_ | (uint)!bVar30 * *(int *)(local_1670.ray + 0x84);
                bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
                auVar34._8_4_ =
                     (uint)bVar30 * auVar33._8_4_ | (uint)!bVar30 * *(int *)(local_1670.ray + 0x88);
                bVar30 = SUB81(uVar32 >> 3,0);
                auVar34._12_4_ =
                     (uint)bVar30 * auVar33._12_4_ | (uint)!bVar30 * *(int *)(local_1670.ray + 0x8c)
                ;
                *(undefined1 (*) [16])(local_1670.ray + 0x80) = auVar34;
                if ((byte)uVar32 != 0) goto LAB_007a3267;
              }
              *(int *)(ray + k * 4 + 0x80) = auVar92._0_4_;
              local_1680 = local_1680 ^ 1L << (uVar20 & 0x3f);
            }
          } while (local_1680 != 0);
        }
        local_1688 = local_1688 + 1;
      } while (local_1688 != uVar24 - 8);
    }
LAB_007a3251:
    bVar31 = puVar26 != &local_1200;
    if (!bVar31) {
      return bVar31;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }